

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512bw_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  uint32_t *puVar5;
  undefined1 (*pauVar6) [64];
  ulong uVar7;
  uint16_t *puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar54 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar55 [16];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar56 [16];
  undefined1 in_ZMM30 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  
  auVar9 = in_ZMM19._0_16_;
  auVar55 = in_ZMM18._0_16_;
  auVar54 = in_ZMM17._0_16_;
  auVar53 = in_ZMM16._0_16_;
  auVar56 = in_ZMM30._0_16_;
  auVar11 = in_ZMM29._0_16_;
  auVar10 = in_ZMM28._0_16_;
  uVar7 = 0;
  memset(local_4c0,0,0x400);
  uVar3 = len >> 9;
  if (0xfffff < len) {
    auVar13 = vpbroadcastb_avx512bw(ZEXT116(0x55));
    auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x33));
    puVar8 = array + 0x1e0;
    uVar7 = 0;
    do {
      auVar9 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      in_ZMM27 = ZEXT1664(auVar9);
      auVar9 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      in_ZMM24 = ZEXT1664(auVar9);
      auVar9 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      in_ZMM26 = ZEXT1664(auVar9);
      auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar9 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      in_ZMM23 = ZEXT1664(auVar9);
      auVar42 = ZEXT1664((undefined1  [16])0x0);
      auVar43 = ZEXT1664((undefined1  [16])0x0);
      auVar44 = ZEXT1664((undefined1  [16])0x0);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar46 = ZEXT1664((undefined1  [16])0x0);
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      auVar49 = ZEXT1664((undefined1  [16])0x0);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      auVar51 = ZEXT1664((undefined1  [16])0x0);
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      lVar4 = 0;
      do {
        auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x3c0));
        auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x380));
        auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x340));
        auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x300));
        auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x2c0));
        auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x280));
        auVar21 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x240));
        auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x200));
        auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x1c0));
        auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x180));
        auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x140));
        auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x100));
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0xc0));
        auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x80));
        auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4 + -0x40));
        auVar30 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar8 + lVar4));
        lVar4 = lVar4 + 0x400;
        auVar31 = vpandq_avx512f(auVar15,auVar13);
        auVar32 = vpandq_avx512f(auVar16,auVar13);
        auVar16 = vpsrlw_avx512bw(auVar16,1);
        auVar15 = vpsrlw_avx512bw(auVar15,1);
        auVar33 = vpandq_avx512f(auVar18,auVar13);
        auVar18 = vpsrlw_avx512bw(auVar18,1);
        auVar31 = vpaddb_avx512bw(auVar32,auVar31);
        auVar15 = vpandq_avx512f(auVar15,auVar13);
        auVar16 = vpandq_avx512f(auVar16,auVar13);
        auVar32 = vpandq_avx512f(auVar17,auVar13);
        auVar15 = vpaddb_avx512bw(auVar16,auVar15);
        auVar16 = vpaddb_avx512bw(auVar33,auVar32);
        auVar17 = vpsrlw_avx512bw(auVar17,1);
        auVar18 = vpandq_avx512f(auVar18,auVar13);
        auVar32 = vpandq_avx512f(auVar20,auVar13);
        auVar20 = vpsrlw_avx512bw(auVar20,1);
        auVar17 = vpandq_avx512f(auVar17,auVar13);
        auVar33 = vpandq_avx512f(auVar19,auVar13);
        auVar17 = vpaddb_avx512bw(auVar18,auVar17);
        auVar18 = vpaddb_avx512bw(auVar32,auVar33);
        auVar19 = vpsrlw_avx512bw(auVar19,1);
        auVar20 = vpandq_avx512f(auVar20,auVar13);
        auVar32 = vpandq_avx512f(auVar22,auVar13);
        auVar22 = vpsrlw_avx512bw(auVar22,1);
        auVar19 = vpandq_avx512f(auVar19,auVar13);
        auVar33 = vpsrlw_avx512bw(auVar21,1);
        auVar19 = vpaddb_avx512bw(auVar20,auVar19);
        auVar20 = vpandq_avx512f(auVar21,auVar13);
        auVar21 = vpandq_avx512f(auVar22,auVar13);
        auVar22 = vpandq_avx512f(auVar24,auVar13);
        auVar24 = vpsrlw_avx512bw(auVar24,1);
        auVar20 = vpaddb_avx512bw(auVar32,auVar20);
        auVar32 = vpandq_avx512f(auVar33,auVar13);
        auVar33 = vpsrlw_avx512bw(auVar23,1);
        auVar21 = vpaddb_avx512bw(auVar21,auVar32);
        auVar23 = vpandq_avx512f(auVar23,auVar13);
        auVar24 = vpandq_avx512f(auVar24,auVar13);
        auVar32 = vpandq_avx512f(auVar26,auVar13);
        auVar26 = vpsrlw_avx512bw(auVar26,1);
        auVar22 = vpaddb_avx512bw(auVar22,auVar23);
        auVar23 = vpandq_avx512f(auVar33,auVar13);
        auVar33 = vpandq_avx512f(auVar25,auVar13);
        auVar23 = vpaddb_avx512bw(auVar24,auVar23);
        auVar24 = vpaddb_avx512bw(auVar32,auVar33);
        auVar25 = vpsrlw_avx512bw(auVar25,1);
        auVar26 = vpandq_avx512f(auVar26,auVar13);
        auVar32 = vpandq_avx512f(auVar28,auVar13);
        auVar28 = vpsrlw_avx512bw(auVar28,1);
        auVar25 = vpandq_avx512f(auVar25,auVar13);
        auVar33 = vpandq_avx512f(auVar27,auVar13);
        auVar25 = vpaddb_avx512bw(auVar26,auVar25);
        auVar26 = vpaddb_avx512bw(auVar32,auVar33);
        auVar27 = vpsrlw_avx512bw(auVar27,1);
        auVar28 = vpandq_avx512f(auVar28,auVar13);
        auVar32 = vpandq_avx512f(auVar30,auVar13);
        auVar30 = vpsrlw_avx512bw(auVar30,1);
        auVar27 = vpandq_avx512f(auVar27,auVar13);
        auVar33 = vpsrlw_avx512bw(auVar29,1);
        auVar30 = vpandq_avx512f(auVar30,auVar13);
        auVar27 = vpaddb_avx512bw(auVar28,auVar27);
        auVar28 = vpandq_avx512f(auVar29,auVar13);
        auVar29 = vpandq_avx512f(auVar16,auVar14);
        auVar16 = vpsrlw_avx512bw(auVar16,2);
        auVar28 = vpaddb_avx512bw(auVar32,auVar28);
        auVar13 = vpandq_avx512f(auVar33,auVar13);
        auVar32 = vpandq_avx512f(auVar31,auVar14);
        auVar31 = vpsrlw_avx512bw(auVar31,2);
        auVar16 = vpandq_avx512f(auVar16,auVar14);
        auVar33 = vpandq_avx512f(auVar22,auVar14);
        auVar31 = vpandq_avx512f(auVar31,auVar14);
        auVar13 = vpaddb_avx512bw(auVar30,auVar13);
        auVar29 = vpaddb_avx512bw(auVar29,auVar32);
        auVar30 = vpandq_avx512f(auVar18,auVar14);
        auVar32 = vpandq_avx512f(auVar20,auVar14);
        auVar18 = vpsrlw_avx512bw(auVar18,2);
        auVar20 = vpsrlw_avx512bw(auVar20,2);
        auVar16 = vpaddb_avx512bw(auVar16,auVar31);
        auVar30 = vpaddb_avx512bw(auVar32,auVar30);
        auVar31 = vpandq_avx512f(auVar24,auVar14);
        auVar18 = vpandq_avx512f(auVar18,auVar14);
        auVar20 = vpandq_avx512f(auVar20,auVar14);
        auVar22 = vpsrlw_avx512bw(auVar22,2);
        auVar31 = vpaddb_avx512bw(auVar31,auVar33);
        auVar24 = vpsrlw_avx512bw(auVar24,2);
        auVar18 = vpaddb_avx512bw(auVar20,auVar18);
        auVar20 = vpandq_avx512f(auVar22,auVar14);
        auVar22 = vpandq_avx512f(auVar26,auVar14);
        auVar32 = vpandq_avx512f(auVar28,auVar14);
        auVar24 = vpandq_avx512f(auVar24,auVar14);
        auVar33 = vpandq_avx512f(auVar15,auVar14);
        auVar15 = vpsrlw_avx512bw(auVar15,2);
        auVar22 = vpaddb_avx512bw(auVar32,auVar22);
        auVar20 = vpaddb_avx512bw(auVar24,auVar20);
        auVar24 = vpsrlw_avx512bw(auVar26,2);
        auVar26 = vpsrlw_avx512bw(auVar28,2);
        auVar15 = vpandq_avx512f(auVar15,auVar14);
        auVar26 = vpandq_avx512f(auVar26,auVar14);
        auVar28 = vpandq_avx512f(auVar17,auVar14);
        auVar17 = vpsrlw_avx512bw(auVar17,2);
        auVar24 = vpandq_avx512f(auVar24,auVar14);
        auVar17 = vpandq_avx512f(auVar17,auVar14);
        auVar28 = vpaddb_avx512bw(auVar28,auVar33);
        auVar24 = vpaddb_avx512bw(auVar26,auVar24);
        auVar26 = vpsrlw_avx512bw(auVar19,2);
        auVar32 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar15 = vpaddb_avx512bw(auVar17,auVar15);
        auVar17 = vpandq_avx512f(auVar19,auVar14);
        auVar19 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar14 = vpandq_avx512f(auVar21,auVar14);
        auVar21 = vpsrlw_avx512bw(auVar21,2);
        auVar14 = vpaddb_avx512bw(auVar14,auVar17);
        auVar17 = vpandq_avx512f(auVar26,auVar32);
        auVar19 = vpandq_avx512f(auVar21,auVar19);
        auVar21 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar17 = vpaddb_avx512bw(auVar19,auVar17);
        auVar19 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar26 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar19 = vpandq_avx512f(auVar23,auVar19);
        auVar26 = vpandq_avx512f(auVar25,auVar26);
        auVar19 = vpaddb_avx512bw(auVar26,auVar19);
        auVar23 = vpsrlw_avx512bw(auVar23,2);
        auVar26 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar25 = vpsrlw_avx512bw(auVar25,2);
        auVar32 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar21 = vpandq_avx512f(auVar25,auVar21);
        auVar25 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar23 = vpandq_avx512f(auVar23,auVar26);
        auVar21 = vpaddb_avx512bw(auVar21,auVar23);
        auVar23 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar26 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar26 = vpandq_avx512f(auVar13,auVar26);
        auVar23 = vpandq_avx512f(auVar27,auVar23);
        auVar13 = vpsrlw_avx512bw(auVar13,2);
        auVar23 = vpaddb_avx512bw(auVar26,auVar23);
        auVar26 = vpsrlw_avx512bw(auVar27,2);
        auVar27 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar13 = vpandq_avx512f(auVar13,auVar32);
        auVar25 = vpandq_avx512f(auVar26,auVar25);
        auVar26 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar13 = vpaddb_avx512bw(auVar13,auVar25);
        auVar25 = vpandq_avx512f(auVar30,auVar27);
        auVar27 = vpsrlw_avx512bw(auVar30,4);
        auVar26 = vpandq_avx512f(auVar29,auVar26);
        auVar25 = vpaddb_avx512bw(auVar25,auVar26);
        auVar26 = vpsrlw_avx512bw(auVar29,4);
        auVar29 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar26 = vpandq_avx512f(auVar26,auVar29);
        auVar27 = vpandq_avx512f(auVar27,auVar29);
        auVar30 = vpandq_avx512f(auVar22,auVar29);
        auVar32 = vpandq_avx512f(auVar31,auVar29);
        auVar22 = vpsrlw_avx512bw(auVar22,4);
        auVar33 = vpandq_avx512f(auVar28,auVar29);
        auVar26 = vpaddb_avx512bw(auVar27,auVar26);
        auVar27 = vpaddb_avx512bw(auVar30,auVar32);
        auVar30 = vpsrlw_avx512bw(auVar31,4);
        auVar22 = vpandq_avx512f(auVar22,auVar29);
        auVar31 = vpandq_avx512f(auVar16,auVar29);
        auVar16 = vpsrlw_avx512bw(auVar16,4);
        auVar30 = vpandq_avx512f(auVar30,auVar29);
        auVar32 = vpandq_avx512f(auVar14,auVar29);
        auVar14 = vpsrlw_avx512bw(auVar14,4);
        auVar16 = vpandq_avx512f(auVar16,auVar29);
        auVar22 = vpaddb_avx512bw(auVar22,auVar30);
        auVar30 = vpaddb_avx512bw(auVar32,auVar33);
        auVar28 = vpsrlw_avx512bw(auVar28,4);
        auVar32 = vpandq_avx512f(auVar19,auVar29);
        auVar19 = vpsrlw_avx512bw(auVar19,4);
        auVar14 = vpandq_avx512f(auVar14,auVar29);
        auVar28 = vpandq_avx512f(auVar28,auVar29);
        auVar33 = vpandq_avx512f(auVar23,auVar29);
        auVar23 = vpsrlw_avx512bw(auVar23,4);
        auVar19 = vpandq_avx512f(auVar19,auVar29);
        auVar28 = vpaddb_avx512bw(auVar14,auVar28);
        auVar14 = vpaddb_avx512bw(auVar33,auVar32);
        auVar23 = vpandq_avx512f(auVar23,auVar29);
        auVar32 = vpandq_avx512f(auVar18,auVar29);
        auVar18 = vpsrlw_avx512bw(auVar18,4);
        auVar33 = vpandq_avx512f(auVar20,auVar29);
        auVar20 = vpsrlw_avx512bw(auVar20,4);
        auVar19 = vpaddb_avx512bw(auVar23,auVar19);
        auVar23 = vpaddb_avx512bw(auVar32,auVar31);
        auVar31 = vpandq_avx512f(auVar24,auVar29);
        auVar18 = vpandq_avx512f(auVar18,auVar29);
        auVar24 = vpsrlw_avx512bw(auVar24,4);
        auVar32 = vpsrlw_avx512bw(auVar25,8);
        auVar16 = vpaddb_avx512bw(auVar18,auVar16);
        auVar18 = vpaddb_avx512bw(auVar31,auVar33);
        auVar20 = vpandq_avx512f(auVar20,auVar29);
        auVar24 = vpandq_avx512f(auVar24,auVar29);
        auVar31 = vpandq_avx512f(auVar15,auVar29);
        auVar33 = vpandq_avx512f(auVar17,auVar29);
        auVar15 = vpsrlw_avx512bw(auVar15,4);
        auVar17 = vpsrlw_avx512bw(auVar17,4);
        auVar20 = vpaddb_avx512bw(auVar24,auVar20);
        auVar9 = auVar20._0_16_;
        auVar24 = vpaddb_avx512bw(auVar33,auVar31);
        auVar15 = vpandq_avx512f(auVar15,auVar29);
        auVar17 = vpandq_avx512f(auVar17,auVar29);
        auVar31 = vpandq_avx512f(auVar21,auVar29);
        auVar21 = vpsrlw_avx512bw(auVar21,4);
        auVar33 = vpandq_avx512f(auVar13,auVar29);
        auVar13 = vpsrlw_avx512bw(auVar13,4);
        auVar21 = vpandq_avx512f(auVar21,auVar29);
        auVar13 = vpandq_avx512f(auVar13,auVar29);
        auVar29 = vpbroadcastw_avx512bw(ZEXT216(0xf));
        auVar11 = auVar29._0_16_;
        auVar15 = vpaddb_avx512bw(auVar17,auVar15);
        auVar17 = vpaddb_avx512bw(auVar33,auVar31);
        auVar31 = vmovdqa64_avx512f(in_ZMM27);
        auVar13 = vpaddb_avx512bw(auVar13,auVar21);
        auVar21 = vpandq_avx512f(auVar25,auVar29);
        auVar25 = vpandq_avx512f(auVar27,auVar29);
        auVar27 = vpsrlw_avx512bw(auVar27,8);
        auVar33 = vmovdqa64_avx512f(in_ZMM26);
        auVar21 = vpaddb_avx512bw(auVar25,auVar21);
        auVar25 = vpaddb_avx512bw(auVar27,auVar32);
        in_ZMM27 = vpaddw_avx512bw(auVar31,auVar21);
        auVar21 = vpandq_avx512f(auVar30,auVar29);
        auVar27 = vpandq_avx512f(auVar14,auVar29);
        auVar45 = vpaddw_avx512bw(auVar45,auVar25);
        auVar25 = vpsrlw_avx512bw(auVar30,8);
        auVar21 = vpaddb_avx512bw(auVar27,auVar21);
        auVar27 = vmovdqa64_avx512f(in_ZMM24);
        in_ZMM24 = vpaddw_avx512bw(auVar27,auVar21);
        auVar21 = vpsrlw_avx512bw(auVar14,8);
        auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar21 = vpaddb_avx512bw(auVar21,auVar25);
        auVar25 = vpandq_avx512f(auVar23,auVar29);
        auVar27 = vpandq_avx512f(auVar18,auVar29);
        auVar23 = vpsrlw_avx512bw(auVar23,8);
        auVar46 = vpaddw_avx512bw(auVar46,auVar21);
        auVar21 = vpaddb_avx512bw(auVar27,auVar25);
        auVar41 = vmovdqa64_avx512f(auVar41);
        auVar56 = auVar41._0_16_;
        auVar18 = vpsrlw_avx512bw(auVar18,8);
        auVar25 = vmovdqa64_avx512f(in_ZMM23);
        auVar10 = auVar25._0_16_;
        in_ZMM26 = vpaddw_avx512bw(auVar33,auVar21);
        auVar18 = vpaddb_avx512bw(auVar18,auVar23);
        auVar21 = vpandq_avx512f(auVar17,auVar29);
        auVar47 = vpaddw_avx512bw(auVar47,auVar18);
        auVar18 = vpandq_avx512f(auVar24,auVar29);
        auVar23 = vpsrlw_avx512bw(auVar24,8);
        auVar18 = vpaddb_avx512bw(auVar21,auVar18);
        auVar17 = vpsrlw_avx512bw(auVar17,8);
        auVar21 = vpsrlw_avx512bw(auVar26,8);
        auVar41 = vpaddw_avx512bw(auVar41,auVar18);
        auVar17 = vpaddb_avx512bw(auVar17,auVar23);
        auVar18 = vpandq_avx512f(auVar22,auVar29);
        auVar48 = vpaddw_avx512bw(auVar48,auVar17);
        auVar17 = vpandq_avx512f(auVar26,auVar29);
        auVar23 = vpandq_avx512f(auVar28,auVar29);
        auVar17 = vpaddb_avx512bw(auVar18,auVar17);
        auVar18 = vpsrlw_avx512bw(auVar22,8);
        auVar22 = vpsrlw_avx512bw(auVar28,8);
        auVar55 = auVar22._0_16_;
        in_ZMM23 = vpaddw_avx512bw(auVar25,auVar17);
        auVar17 = vpaddb_avx512bw(auVar18,auVar21);
        auVar18 = vpandq_avx512f(auVar19,auVar29);
        auVar49 = vpaddw_avx512bw(auVar49,auVar17);
        auVar17 = vpaddb_avx512bw(auVar18,auVar23);
        auVar18 = vpsrlw_avx512bw(auVar19,8);
        auVar19 = vpandq_avx512f(auVar16,auVar29);
        auVar16 = vpsrlw_avx512bw(auVar16,8);
        auVar54 = auVar16._0_16_;
        auVar42 = vpaddw_avx512bw(auVar42,auVar17);
        auVar17 = vpaddb_avx512bw(auVar18,auVar22);
        auVar18 = vpandq_avx512f(auVar20,auVar29);
        auVar50 = vpaddw_avx512bw(auVar50,auVar17);
        auVar17 = vpaddb_avx512bw(auVar18,auVar19);
        auVar18 = vpsrlw_avx512bw(auVar20,8);
        auVar19 = vpandq_avx512f(auVar15,auVar29);
        auVar53 = auVar19._0_16_;
        auVar43 = vpaddw_avx512bw(auVar43,auVar17);
        auVar16 = vpaddb_avx512bw(auVar18,auVar16);
        auVar17 = vpandq_avx512f(auVar13,auVar29);
        auVar18 = vpsrlw_avx512bw(auVar13,8);
        auVar51 = vpaddw_avx512bw(auVar51,auVar16);
        auVar16 = vpaddb_avx512bw(auVar17,auVar19);
        auVar13 = vpbroadcastb_avx512bw(ZEXT116(0x55));
        auVar44 = vpaddw_avx512bw(auVar44,auVar16);
        auVar15 = vpsrlw_avx512bw(auVar15,8);
        auVar15 = vpaddb_avx512bw(auVar18,auVar15);
        auVar52 = vpaddw_avx512bw(auVar52,auVar15);
      } while (lVar4 != 0x200000);
      local_4c0 = vmovdqa64_avx512f(in_ZMM27);
      local_480 = vmovdqa64_avx512f(in_ZMM24);
      local_440 = vmovdqa64_avx512f(in_ZMM26);
      local_400 = vmovdqa64_avx512f(auVar41);
      local_3c0 = vmovdqa64_avx512f(in_ZMM23);
      local_380 = vmovdqa64_avx512f(auVar42);
      local_340 = vmovdqa64_avx512f(auVar43);
      local_300 = vmovdqa64_avx512f(auVar44);
      local_2c0 = vmovdqa64_avx512f(auVar45);
      local_280 = vmovdqa64_avx512f(auVar46);
      local_240 = vmovdqa64_avx512f(auVar47);
      local_200 = vmovdqa64_avx512f(auVar48);
      local_1c0 = vmovdqa64_avx512f(auVar49);
      local_180 = vmovdqa64_avx512f(auVar50);
      local_140 = vmovdqa64_avx512f(auVar51);
      local_100 = vmovdqa64_avx512f(auVar52);
      lVar4 = 0;
      puVar5 = flags;
      do {
        auVar13 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_4c0 + lVar4 * 4));
        auVar14 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_4c0 + lVar4 * 4 + 0x20));
        lVar4 = lVar4 + 0x10;
        auVar13 = vpaddd_avx512f(ZEXT464(*puVar5),auVar13);
        auVar13 = vpaddd_avx512f(auVar13,auVar14);
        auVar12 = vextracti64x4_avx512f(auVar13,1);
        auVar13 = vpaddd_avx512f(auVar13,ZEXT3264(auVar12));
        auVar1 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar2 = vpshufd_avx(auVar1,0x55);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        *puVar5 = auVar1._0_4_;
        puVar5 = puVar5 + 1;
      } while (lVar4 != 0x100);
      memset(local_4c0,0,0x400);
      auVar13 = vpbroadcastb_avx512bw(ZEXT116(0x55));
      auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x33));
      uVar7 = uVar7 + 1;
      puVar8 = puVar8 + 0x100000;
    } while (uVar7 != len >> 0x14);
    uVar7 = (ulong)((len >> 0x14) << 0xb);
  }
  lVar4 = uVar3 - uVar7;
  if (uVar3 < uVar7 || lVar4 == 0) {
    uVar3 = (uint)uVar7;
  }
  else {
    auVar13 = vpbroadcastb_avx512bw(ZEXT116(0x55));
    auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x33));
    auVar45 = vpbroadcastb_avx512bw(ZEXT116(7));
    auVar46 = vpbroadcastw_avx512bw(ZEXT216(0xf));
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar51 = ZEXT1664((undefined1  [16])0x0);
    auVar10 = vpxord_avx512vl(auVar10,auVar10);
    auVar50 = ZEXT1664(auVar10);
    auVar11 = vpxord_avx512vl(auVar11,auVar11);
    auVar49 = ZEXT1664(auVar11);
    auVar11 = vpxord_avx512vl(auVar56,auVar56);
    auVar47 = ZEXT1664(auVar11);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    auVar44 = ZEXT1664((undefined1  [16])0x0);
    auVar11 = vpxord_avx512vl(auVar53,auVar53);
    auVar43 = ZEXT1664(auVar11);
    auVar11 = vpxord_avx512vl(auVar54,auVar54);
    auVar42 = ZEXT1664(auVar11);
    auVar11 = vpxord_avx512vl(auVar55,auVar55);
    auVar48 = ZEXT1664(auVar11);
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar41 = ZEXT1664(auVar9);
    pauVar6 = (undefined1 (*) [64])(array + uVar7 * 0x200 + 0x1e0);
    do {
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar21 = vmovdqu64_avx512f(pauVar6[-0xf]);
      auVar22 = vmovdqu64_avx512f(pauVar6[-0xe]);
      auVar23 = vmovdqu64_avx512f(pauVar6[-0xd]);
      auVar24 = vmovdqu64_avx512f(pauVar6[-0xc]);
      auVar25 = vmovdqu64_avx512f(pauVar6[-10]);
      auVar26 = vmovdqu64_avx512f(pauVar6[-0xb]);
      auVar27 = vmovdqu64_avx512f(pauVar6[-9]);
      auVar28 = vmovdqu64_avx512f(pauVar6[-8]);
      auVar51 = vmovdqa64_avx512f(auVar51);
      auVar49 = vmovdqa64_avx512f(auVar49);
      auVar50 = vmovdqa64_avx512f(auVar50);
      auVar29 = vmovdqu64_avx512f(pauVar6[-7]);
      auVar30 = vmovdqu64_avx512f(pauVar6[-6]);
      auVar47 = vmovdqa64_avx512f(auVar47);
      auVar31 = vmovdqu64_avx512f(pauVar6[-5]);
      auVar32 = vmovdqu64_avx512f(pauVar6[-4]);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar33 = vmovdqu64_avx512f(pauVar6[-3]);
      auVar34 = vmovdqu64_avx512f(pauVar6[-2]);
      auVar52 = vmovdqa64_avx512f(auVar52);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar35 = vmovdqu64_avx512f(pauVar6[-1]);
      auVar36 = vmovdqu64_avx512f(*pauVar6);
      pauVar6 = pauVar6 + 0x10;
      lVar4 = lVar4 + -1;
      auVar37 = vpandq_avx512f(auVar21,auVar13);
      auVar38 = vpandq_avx512f(auVar22,auVar13);
      auVar21 = vpsrlw_avx512bw(auVar21,1);
      auVar22 = vpsrlw_avx512bw(auVar22,1);
      auVar39 = vpandq_avx512f(auVar24,auVar13);
      auVar40 = vpandq_avx512f(auVar25,auVar13);
      auVar21 = vpandq_avx512f(auVar21,auVar13);
      auVar22 = vpandq_avx512f(auVar22,auVar13);
      auVar37 = vpaddb_avx512bw(auVar38,auVar37);
      auVar21 = vpaddb_avx512bw(auVar22,auVar21);
      auVar22 = vpandq_avx512f(auVar23,auVar13);
      auVar22 = vpaddb_avx512bw(auVar39,auVar22);
      auVar23 = vpsrlw_avx512bw(auVar23,1);
      auVar24 = vpsrlw_avx512bw(auVar24,1);
      auVar23 = vpandq_avx512f(auVar23,auVar13);
      auVar24 = vpandq_avx512f(auVar24,auVar13);
      auVar23 = vpaddb_avx512bw(auVar24,auVar23);
      auVar24 = vpandq_avx512f(auVar26,auVar13);
      auVar24 = vpaddb_avx512bw(auVar40,auVar24);
      auVar26 = vpsrlw_avx512bw(auVar26,1);
      auVar25 = vpsrlw_avx512bw(auVar25,1);
      auVar38 = vpandq_avx512f(auVar28,auVar13);
      auVar26 = vpandq_avx512f(auVar26,auVar13);
      auVar25 = vpandq_avx512f(auVar25,auVar13);
      auVar25 = vpaddb_avx512bw(auVar25,auVar26);
      auVar26 = vpandq_avx512f(auVar27,auVar13);
      auVar26 = vpaddb_avx512bw(auVar38,auVar26);
      auVar27 = vpsrlw_avx512bw(auVar27,1);
      auVar28 = vpsrlw_avx512bw(auVar28,1);
      auVar38 = vpandq_avx512f(auVar30,auVar13);
      auVar27 = vpandq_avx512f(auVar27,auVar13);
      auVar28 = vpandq_avx512f(auVar28,auVar13);
      auVar27 = vpaddb_avx512bw(auVar28,auVar27);
      auVar28 = vpandq_avx512f(auVar29,auVar13);
      auVar28 = vpaddb_avx512bw(auVar38,auVar28);
      auVar29 = vpsrlw_avx512bw(auVar29,1);
      auVar30 = vpsrlw_avx512bw(auVar30,1);
      auVar38 = vpandq_avx512f(auVar32,auVar13);
      auVar29 = vpandq_avx512f(auVar29,auVar13);
      auVar30 = vpandq_avx512f(auVar30,auVar13);
      auVar29 = vpaddb_avx512bw(auVar30,auVar29);
      auVar30 = vpandq_avx512f(auVar31,auVar13);
      auVar30 = vpaddb_avx512bw(auVar38,auVar30);
      auVar31 = vpsrlw_avx512bw(auVar31,1);
      auVar32 = vpsrlw_avx512bw(auVar32,1);
      auVar38 = vpandq_avx512f(auVar34,auVar13);
      auVar31 = vpandq_avx512f(auVar31,auVar13);
      auVar32 = vpandq_avx512f(auVar32,auVar13);
      auVar31 = vpaddb_avx512bw(auVar32,auVar31);
      auVar32 = vpandq_avx512f(auVar33,auVar13);
      auVar32 = vpaddb_avx512bw(auVar38,auVar32);
      auVar33 = vpsrlw_avx512bw(auVar33,1);
      auVar34 = vpsrlw_avx512bw(auVar34,1);
      auVar38 = vpandq_avx512f(auVar35,auVar13);
      auVar35 = vpsrlw_avx512bw(auVar35,1);
      auVar39 = vpsrlw_avx512bw(auVar37,2);
      auVar34 = vpandq_avx512f(auVar34,auVar13);
      auVar40 = vpandq_avx512f(auVar36,auVar13);
      auVar33 = vpandq_avx512f(auVar33,auVar13);
      auVar38 = vpaddb_avx512bw(auVar40,auVar38);
      auVar36 = vpsrlw_avx512bw(auVar36,1);
      auVar33 = vpaddb_avx512bw(auVar34,auVar33);
      auVar34 = vpandq_avx512f(auVar35,auVar13);
      auVar35 = vpandq_avx512f(auVar37,auVar14);
      auVar37 = vpandq_avx512f(auVar22,auVar14);
      auVar36 = vpandq_avx512f(auVar36,auVar13);
      auVar34 = vpaddb_avx512bw(auVar36,auVar34);
      auVar35 = vpaddb_avx512bw(auVar37,auVar35);
      auVar22 = vpsrlw_avx512bw(auVar22,2);
      auVar36 = vpandq_avx512f(auVar39,auVar14);
      auVar37 = vpandq_avx512f(auVar26,auVar14);
      auVar39 = vpsrlw_avx512bw(auVar24,2);
      auVar22 = vpandq_avx512f(auVar22,auVar14);
      auVar22 = vpaddb_avx512bw(auVar22,auVar36);
      auVar24 = vpandq_avx512f(auVar24,auVar14);
      auVar36 = vpandq_avx512f(auVar39,auVar14);
      auVar39 = vpsrlw_avx512bw(auVar28,2);
      auVar24 = vpaddb_avx512bw(auVar37,auVar24);
      auVar26 = vpsrlw_avx512bw(auVar26,2);
      auVar37 = vpandq_avx512f(auVar30,auVar14);
      auVar26 = vpandq_avx512f(auVar26,auVar14);
      auVar26 = vpaddb_avx512bw(auVar26,auVar36);
      auVar28 = vpandq_avx512f(auVar28,auVar14);
      auVar36 = vpandq_avx512f(auVar39,auVar14);
      auVar39 = vpandq_avx512f(auVar38,auVar14);
      auVar40 = vpsrlw_avx512bw(auVar32,2);
      auVar38 = vpsrlw_avx512bw(auVar38,2);
      auVar28 = vpaddb_avx512bw(auVar37,auVar28);
      auVar30 = vpsrlw_avx512bw(auVar30,2);
      auVar32 = vpandq_avx512f(auVar32,auVar14);
      auVar37 = vpandq_avx512f(auVar38,auVar14);
      auVar30 = vpandq_avx512f(auVar30,auVar14);
      auVar30 = vpaddb_avx512bw(auVar30,auVar36);
      auVar32 = vpaddb_avx512bw(auVar39,auVar32);
      auVar36 = vpandq_avx512f(auVar40,auVar14);
      auVar38 = vpandq_avx512f(auVar21,auVar14);
      auVar21 = vpsrlw_avx512bw(auVar21,2);
      auVar39 = vpandq_avx512f(auVar23,auVar14);
      auVar23 = vpsrlw_avx512bw(auVar23,2);
      auVar21 = vpandq_avx512f(auVar21,auVar14);
      auVar23 = vpandq_avx512f(auVar23,auVar14);
      auVar36 = vpaddb_avx512bw(auVar37,auVar36);
      auVar37 = vpaddb_avx512bw(auVar39,auVar38);
      auVar38 = vpandq_avx512f(auVar27,auVar14);
      auVar27 = vpsrlw_avx512bw(auVar27,2);
      auVar21 = vpaddb_avx512bw(auVar23,auVar21);
      auVar23 = vpandq_avx512f(auVar25,auVar14);
      auVar27 = vpandq_avx512f(auVar27,auVar14);
      auVar23 = vpaddb_avx512bw(auVar38,auVar23);
      auVar25 = vpsrlw_avx512bw(auVar25,2);
      auVar38 = vpandq_avx512f(auVar31,auVar14);
      auVar25 = vpandq_avx512f(auVar25,auVar14);
      auVar25 = vpaddb_avx512bw(auVar27,auVar25);
      auVar27 = vpandq_avx512f(auVar29,auVar14);
      auVar27 = vpaddb_avx512bw(auVar38,auVar27);
      auVar29 = vpsrlw_avx512bw(auVar29,2);
      auVar31 = vpsrlw_avx512bw(auVar31,2);
      auVar38 = vpandq_avx512f(auVar34,auVar14);
      auVar34 = vpsrlw_avx512bw(auVar34,2);
      auVar29 = vpandq_avx512f(auVar29,auVar14);
      auVar31 = vpandq_avx512f(auVar31,auVar14);
      auVar34 = vpandq_avx512f(auVar34,auVar14);
      auVar29 = vpaddb_avx512bw(auVar31,auVar29);
      auVar31 = vpandq_avx512f(auVar33,auVar14);
      auVar33 = vpsrlw_avx512bw(auVar33,2);
      auVar39 = vpandq_avx512f(auVar35,auVar45);
      auVar35 = vpsrlw_avx512bw(auVar35,4);
      auVar31 = vpaddb_avx512bw(auVar38,auVar31);
      auVar38 = vpandq_avx512f(auVar24,auVar45);
      auVar24 = vpsrlw_avx512bw(auVar24,4);
      auVar33 = vpandq_avx512f(auVar33,auVar14);
      auVar35 = vpandq_avx512f(auVar35,auVar45);
      auVar24 = vpandq_avx512f(auVar24,auVar45);
      auVar33 = vpaddb_avx512bw(auVar34,auVar33);
      auVar34 = vpaddb_avx512bw(auVar38,auVar39);
      auVar38 = vpandq_avx512f(auVar32,auVar45);
      auVar24 = vpaddb_avx512bw(auVar24,auVar35);
      auVar35 = vpandq_avx512f(auVar28,auVar45);
      auVar28 = vpsrlw_avx512bw(auVar28,4);
      auVar35 = vpaddb_avx512bw(auVar38,auVar35);
      auVar32 = vpsrlw_avx512bw(auVar32,4);
      auVar28 = vpandq_avx512f(auVar28,auVar45);
      auVar38 = vpandq_avx512f(auVar23,auVar45);
      auVar23 = vpsrlw_avx512bw(auVar23,4);
      auVar32 = vpandq_avx512f(auVar32,auVar45);
      auVar28 = vpaddb_avx512bw(auVar32,auVar28);
      auVar32 = vpandq_avx512f(auVar37,auVar45);
      auVar37 = vpsrlw_avx512bw(auVar37,4);
      auVar23 = vpandq_avx512f(auVar23,auVar45);
      auVar39 = vpsrlw_avx512bw(auVar27,4);
      auVar37 = vpandq_avx512f(auVar37,auVar45);
      auVar32 = vpaddb_avx512bw(auVar38,auVar32);
      auVar38 = vpandq_avx512f(auVar31,auVar45);
      auVar23 = vpaddb_avx512bw(auVar23,auVar37);
      auVar27 = vpandq_avx512f(auVar27,auVar45);
      auVar37 = vpandq_avx512f(auVar39,auVar45);
      auVar39 = vpandq_avx512f(auVar26,auVar45);
      auVar27 = vpaddb_avx512bw(auVar38,auVar27);
      auVar31 = vpsrlw_avx512bw(auVar31,4);
      auVar47 = vmovdqa64_avx512f(auVar47);
      auVar31 = vpandq_avx512f(auVar31,auVar45);
      auVar31 = vpaddb_avx512bw(auVar31,auVar37);
      auVar37 = vpandq_avx512f(auVar22,auVar45);
      auVar22 = vpsrlw_avx512bw(auVar22,4);
      auVar37 = vpaddb_avx512bw(auVar39,auVar37);
      auVar26 = vpsrlw_avx512bw(auVar26,4);
      auVar22 = vpandq_avx512f(auVar22,auVar45);
      auVar38 = vpandq_avx512f(auVar36,auVar45);
      auVar26 = vpandq_avx512f(auVar26,auVar45);
      auVar22 = vpaddb_avx512bw(auVar26,auVar22);
      auVar26 = vpandq_avx512f(auVar30,auVar45);
      auVar30 = vpsrlw_avx512bw(auVar30,4);
      auVar26 = vpaddb_avx512bw(auVar38,auVar26);
      auVar36 = vpsrlw_avx512bw(auVar36,4);
      auVar30 = vpandq_avx512f(auVar30,auVar45);
      auVar38 = vpandq_avx512f(auVar21,auVar45);
      auVar39 = vpandq_avx512f(auVar25,auVar45);
      auVar21 = vpsrlw_avx512bw(auVar21,4);
      auVar36 = vpandq_avx512f(auVar36,auVar45);
      auVar30 = vpaddb_avx512bw(auVar36,auVar30);
      auVar36 = vpaddb_avx512bw(auVar39,auVar38);
      auVar25 = vpsrlw_avx512bw(auVar25,4);
      auVar21 = vpandq_avx512f(auVar21,auVar45);
      auVar38 = vpandq_avx512f(auVar29,auVar45);
      auVar29 = vpsrlw_avx512bw(auVar29,4);
      auVar39 = vpandq_avx512f(auVar33,auVar45);
      auVar33 = vpsrlw_avx512bw(auVar33,4);
      auVar25 = vpandq_avx512f(auVar25,auVar45);
      auVar29 = vpandq_avx512f(auVar29,auVar45);
      auVar33 = vpandq_avx512f(auVar33,auVar45);
      auVar21 = vpaddb_avx512bw(auVar25,auVar21);
      auVar25 = vpaddb_avx512bw(auVar39,auVar38);
      auVar38 = vpandq_avx512f(auVar34,auVar46);
      auVar39 = vpandq_avx512f(auVar35,auVar46);
      auVar29 = vpaddb_avx512bw(auVar33,auVar29);
      auVar33 = vpsrlw_avx512bw(auVar34,8);
      auVar34 = vpsrlw_avx512bw(auVar35,8);
      auVar35 = vpaddb_avx512bw(auVar39,auVar38);
      auVar49 = vmovdqa64_avx512f(auVar49);
      auVar33 = vpaddb_avx512bw(auVar34,auVar33);
      auVar34 = vpandq_avx512f(auVar27,auVar46);
      auVar47 = vpaddw_avx512bw(auVar47,auVar33);
      auVar33 = vpandq_avx512f(auVar32,auVar46);
      auVar41 = vpaddw_avx512bw(auVar41,auVar35);
      auVar50 = vmovdqa64_avx512f(auVar50);
      auVar33 = vpaddb_avx512bw(auVar34,auVar33);
      auVar27 = vpsrlw_avx512bw(auVar27,8);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar48 = vpaddw_avx512bw(auVar48,auVar33);
      auVar32 = vpsrlw_avx512bw(auVar32,8);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar27 = vpaddb_avx512bw(auVar27,auVar32);
      auVar32 = vpandq_avx512f(auVar26,auVar46);
      auVar26 = vpsrlw_avx512bw(auVar26,8);
      auVar49 = vpaddw_avx512bw(auVar49,auVar27);
      auVar27 = vpandq_avx512f(auVar37,auVar46);
      auVar27 = vpaddb_avx512bw(auVar32,auVar27);
      auVar51 = vmovdqa64_avx512f(auVar51);
      auVar32 = vpandq_avx512f(auVar25,auVar46);
      auVar42 = vpaddw_avx512bw(auVar42,auVar27);
      auVar27 = vpsrlw_avx512bw(auVar37,8);
      auVar52 = vmovdqa64_avx512f(auVar52);
      auVar26 = vpaddb_avx512bw(auVar26,auVar27);
      auVar50 = vpaddw_avx512bw(auVar50,auVar26);
      auVar26 = vpandq_avx512f(auVar36,auVar46);
      auVar26 = vpaddb_avx512bw(auVar32,auVar26);
      auVar25 = vpsrlw_avx512bw(auVar25,8);
      auVar27 = vpandq_avx512f(auVar24,auVar46);
      auVar43 = vpaddw_avx512bw(auVar43,auVar26);
      auVar26 = vpsrlw_avx512bw(auVar36,8);
      auVar24 = vpsrlw_avx512bw(auVar24,8);
      auVar32 = vpandq_avx512f(auVar23,auVar46);
      auVar25 = vpaddb_avx512bw(auVar25,auVar26);
      auVar26 = vpandq_avx512f(auVar28,auVar46);
      auVar51 = vpaddw_avx512bw(auVar51,auVar25);
      auVar25 = vpaddb_avx512bw(auVar26,auVar27);
      auVar26 = vpsrlw_avx512bw(auVar28,8);
      auVar44 = vpaddw_avx512bw(auVar44,auVar25);
      auVar24 = vpaddb_avx512bw(auVar26,auVar24);
      auVar25 = vpandq_avx512f(auVar31,auVar46);
      auVar23 = vpsrlw_avx512bw(auVar23,8);
      auVar52 = vpaddw_avx512bw(auVar52,auVar24);
      auVar24 = vpaddb_avx512bw(auVar25,auVar32);
      auVar25 = vpsrlw_avx512bw(auVar31,8);
      auVar26 = vpandq_avx512f(auVar22,auVar46);
      auVar15 = vpaddw_avx512bw(auVar15,auVar24);
      auVar23 = vpaddb_avx512bw(auVar25,auVar23);
      auVar24 = vpandq_avx512f(auVar30,auVar46);
      auVar22 = vpsrlw_avx512bw(auVar22,8);
      auVar16 = vpaddw_avx512bw(auVar16,auVar23);
      auVar23 = vpaddb_avx512bw(auVar24,auVar26);
      auVar24 = vpsrlw_avx512bw(auVar30,8);
      auVar25 = vpandq_avx512f(auVar21,auVar46);
      auVar17 = vpaddw_avx512bw(auVar17,auVar23);
      auVar22 = vpaddb_avx512bw(auVar24,auVar22);
      auVar23 = vpandq_avx512f(auVar29,auVar46);
      auVar21 = vpsrlw_avx512bw(auVar21,8);
      auVar18 = vpaddw_avx512bw(auVar18,auVar22);
      auVar22 = vpaddb_avx512bw(auVar23,auVar25);
      auVar23 = vpsrlw_avx512bw(auVar29,8);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar19 = vpaddw_avx512bw(auVar19,auVar22);
      auVar21 = vpaddb_avx512bw(auVar23,auVar21);
      auVar20 = vpaddw_avx512bw(auVar20,auVar21);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar20);
    } while (lVar4 != 0);
    local_4c0 = vmovdqa64_avx512f(auVar41);
    local_480 = vmovdqa64_avx512f(auVar48);
    local_440 = vmovdqa64_avx512f(auVar42);
    local_400 = vmovdqa64_avx512f(auVar43);
    local_3c0 = vmovdqa64_avx512f(auVar44);
    local_380 = vmovdqa64_avx512f(auVar15);
    local_340 = vmovdqa64_avx512f(auVar17);
    local_300 = vmovdqa64_avx512f(auVar19);
    local_2c0 = vmovdqa64_avx512f(auVar47);
    local_280 = vmovdqa64_avx512f(auVar49);
    local_240 = vmovdqa64_avx512f(auVar50);
    local_200 = vmovdqa64_avx512f(auVar51);
    local_1c0 = vmovdqa64_avx512f(auVar52);
    local_180 = vmovdqa64_avx512f(auVar16);
    local_140 = vmovdqa64_avx512f(auVar18);
    local_100 = vmovdqa64_avx512f(auVar20);
  }
  uVar7 = (ulong)(uVar3 << 9);
  if (uVar7 < len) {
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar14 = vpmovsxbd_avx512f(_DAT_0011f080);
    auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar7 = uVar7 + 1;
      auVar46 = vpbroadcastd_avx512f();
      auVar46 = vpsrlvd_avx512f(auVar46,auVar14);
      auVar46 = vpandd_avx512f(auVar46,auVar45);
      auVar13 = vpaddd_avx512f(auVar46,auVar13);
    } while (len != uVar7);
    auVar13 = vmovdqu64_avx512f(auVar13);
    *(undefined1 (*) [64])flags = auVar13;
  }
  lVar4 = 0;
  do {
    auVar13 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_4c0 + lVar4 * 4));
    auVar14 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(local_4c0 + lVar4 * 4 + 0x20));
    lVar4 = lVar4 + 0x10;
    auVar13 = vpaddd_avx512f(ZEXT464(*flags),auVar13);
    auVar13 = vpaddd_avx512f(auVar13,auVar14);
    auVar12 = vextracti64x4_avx512f(auVar13,1);
    auVar13 = vpaddd_avx512f(auVar13,ZEXT3264(auVar12));
    auVar9 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
    auVar11 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpaddd_avx(auVar9,auVar11);
    auVar11 = vpshufd_avx(auVar9,0x55);
    auVar9 = vpaddd_avx(auVar9,auVar11);
    *flags = auVar9._0_4_;
    flags = flags + 1;
  } while (lVar4 != 0x100);
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m512i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm512_setzero_si512();
    }

    const __m512i mask1bit = _mm512_set1_epi16(0x5555); // 0101010101010101 Pattern: 01
    const __m512i mask2bit = _mm512_set1_epi16(0x3333); // 0011001100110011 Pattern: 0011
    const __m512i mask4bit = _mm512_set1_epi16(0x0F0F); // 0000111100001111 Pattern: 00001111
    const __m512i mask8bit = _mm512_set1_epi16(0x00FF); // 0000000011111111 Pattern: 0000000011111111
    
    const uint32_t n_cycles = len / (2048 * (16*32));
    const uint32_t n_total  = len / (16*32);
    uint16_t tmp[32];

/*------ Macros --------*/
#define LE(i,p,k)  const __m512i sum##p##k##_##i##bit_even = _mm512_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m512i sum##p##k##_##i##bit_odd  = _mm512_add_epi8(_mm512_srli_epi16(input##p, i) & mask##i##bit, _mm512_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)           \
    LE(i,0,1)   LO(i,0,1)   \
    LE(i,2,3)   LO(i,2,3)   \
    LE(i,4,5)   LO(i,4,5)   \
    LE(i,6,7)   LO(i,6,7)   \
    LE(i,8,9)   LO(i,8,9)   \
    LE(i,10,11) LO(i,10,11) \
    LE(i,12,13) LO(i,12,13) \
    LE(i,14,15) LO(i,14,15) \

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*2048*512 + j*512 + p*32));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 2048; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)tmp, counters[i]);
            for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm512_setzero_si512();
        }
    }
#undef L
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*512 + p*32));
    i *= 2048;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 512;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LE
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm512_storeu_si512((__m512i*)tmp, counters[i]);
        for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
    }
    return 0;
}